

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O3

int Sim_UtilInfoCompare(Sim_Man_t *p,Abc_Obj_t *pNode)

{
  long lVar1;
  
  if (0 < (long)p->nSimWords) {
    lVar1 = 0;
    do {
      if (*(int *)((long)p->vSim1->pArray[pNode->Id] + lVar1 * 4) !=
          *(int *)((long)p->vSim0->pArray[pNode->Id] + lVar1 * 4)) {
        return 0;
      }
      lVar1 = lVar1 + 1;
    } while (p->nSimWords != lVar1);
  }
  return 1;
}

Assistant:

int Sim_UtilInfoCompare( Sim_Man_t * p, Abc_Obj_t * pNode )
{
    unsigned * pSimInfo1, * pSimInfo2;
    int k;
    pSimInfo1 = (unsigned *)p->vSim0->pArray[pNode->Id];
    pSimInfo2 = (unsigned *)p->vSim1->pArray[pNode->Id];
    for ( k = 0; k < p->nSimWords; k++ )
        if ( pSimInfo2[k] != pSimInfo1[k] )
            return 0;
    return 1;
}